

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDefs.cpp
# Opt level: O2

void vk::checkResult(VkResult result,char *msg,char *file,int line)

{
  OutOfMemoryError *this;
  ostream *poVar1;
  Enum<vk::VkResult,_4UL> local_1c0 [2];
  ostringstream msgStr;
  
  if (result == VK_SUCCESS) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msgStr);
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&msgStr,msg);
    std::operator<<(poVar1,": ");
  }
  local_1c0[0].m_getName = getResultName;
  local_1c0[0].m_value = result;
  tcu::Format::Enum<vk::VkResult,_4UL>::toStream(local_1c0,(ostream *)&msgStr);
  this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  if (0xfffffffd < (uint)result) {
    std::__cxx11::stringbuf::str();
    OutOfMemoryError::OutOfMemoryError
              (this,result,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
    __cxa_throw(this,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  std::__cxx11::stringbuf::str();
  Error::Error((Error *)this,result,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

void checkResult (VkResult result, const char* msg, const char* file, int line)
{
	if (result != VK_SUCCESS)
	{
		std::ostringstream msgStr;
		if (msg)
			msgStr << msg << ": ";

		msgStr << getResultStr(result);

		if (isOutOfMemoryError(result))
			throw OutOfMemoryError(result, msgStr.str().c_str(), DE_NULL, file, line);
		else
			throw Error(result, msgStr.str().c_str(), DE_NULL, file, line);
	}
}